

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O0

Aig_Obj_t ** Aig_TableFind(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t **ppAVar2;
  Aig_Obj_t *pAVar3;
  unsigned_long uVar4;
  Aig_Obj_t *local_28;
  Aig_Obj_t **ppEntry;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  pAVar3 = Aig_ObjChild0(pObj);
  if ((pAVar3 == (Aig_Obj_t *)0x0) || (pAVar3 = Aig_ObjChild1(pObj), pAVar3 == (Aig_Obj_t *)0x0)) {
    __assert_fail("Aig_ObjChild0(pObj) && Aig_ObjChild1(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                  ,0x2d,"Aig_Obj_t **Aig_TableFind(Aig_Man_t *, Aig_Obj_t *)");
  }
  pAVar3 = Aig_ObjFanin0(pObj);
  iVar1 = pAVar3->Id;
  pAVar3 = Aig_ObjFanin1(pObj);
  if (pAVar3->Id <= iVar1) {
    __assert_fail("Aig_ObjFanin0(pObj)->Id < Aig_ObjFanin1(pObj)->Id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                  ,0x2e,"Aig_Obj_t **Aig_TableFind(Aig_Man_t *, Aig_Obj_t *)");
  }
  ppAVar2 = p->pTable;
  uVar4 = Aig_Hash(pObj,p->nTableSize);
  for (local_28 = (Aig_Obj_t *)(ppAVar2 + uVar4); (local_28->field_0).pNext != (Aig_Obj_t *)0x0;
      local_28 = (local_28->field_0).pNext) {
    if ((local_28->field_0).pNext == pObj) {
      return (Aig_Obj_t **)local_28;
    }
  }
  if ((local_28->field_0).pNext == (Aig_Obj_t *)0x0) {
    return (Aig_Obj_t **)local_28;
  }
  __assert_fail("*ppEntry == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                ,0x32,"Aig_Obj_t **Aig_TableFind(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

static Aig_Obj_t ** Aig_TableFind( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t ** ppEntry;
    assert( Aig_ObjChild0(pObj) && Aig_ObjChild1(pObj) );
    assert( Aig_ObjFanin0(pObj)->Id < Aig_ObjFanin1(pObj)->Id );
    for ( ppEntry = p->pTable + Aig_Hash(pObj, p->nTableSize); *ppEntry; ppEntry = &(*ppEntry)->pNext )
        if ( *ppEntry == pObj )
            return ppEntry;
    assert( *ppEntry == NULL );
    return ppEntry;
}